

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void findTextureWidgetsRecursively
               (QWidget *tlw,QWidget *widget,QPlatformTextureList *widgetTextures,
               QList<QWidget_*> *nativeChildren)

{
  bool bVar1;
  QWidgetPrivate *nativeChildren_00;
  QRhiTexture *pQVar2;
  QWidget *this;
  qsizetype qVar3;
  QWidget *pQVar4;
  QWidgetPrivate *pQVar5;
  QPlatformTextureList *in_RCX;
  QWidget *in_RDX;
  QRect *pQVar6;
  QWidget *in_RSI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  QWidgetPrivate *wd;
  TextureData data;
  QRect rect;
  Flags flags;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QPoint *in_stack_ffffffffffffff30;
  QWidget *in_stack_ffffffffffffff48;
  QWidget *in_stack_ffffffffffffff50;
  QWidgetPrivate *in_stack_ffffffffffffff68;
  int local_8c;
  QWidget *widget_00;
  QWidget *tlw_00;
  QRect local_58;
  undefined1 local_48 [20];
  QSize local_34;
  QPoint local_24;
  undefined1 *local_1c;
  undefined1 *local_14;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  nativeChildren_00 = QWidgetPrivate::get((QWidget *)0x3aadf6);
  widget_00 = in_RDX;
  tlw_00 = in_RSI;
  if ((*(uint *)&nativeChildren_00->field_0x250 >> 0x18 & 1) != 0) {
    local_c = 0xaaaaaaaa;
    local_c = (**(code **)(*(long *)nativeChildren_00 + 0x50))();
    local_1c = &DAT_aaaaaaaaaaaaaaaa;
    local_14 = &DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint(in_stack_ffffffffffffff30);
    local_24 = QWidget::mapTo(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(QPoint *)in_RDI);
    local_34 = QWidget::size((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QRect::QRect((QRect *)in_stack_ffffffffffffff50,(QPoint *)in_stack_ffffffffffffff48,in_RDI);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_16_ = (**(code **)(*(long *)nativeChildren_00 + 0x48))();
    pQVar6 = local_48._8_8_;
    pQVar2 = local_48._0_8_;
    widget_00 = in_RDX;
    tlw_00 = in_RSI;
    local_58 = QWidgetPrivate::clipRect(in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff28 = local_c;
    QPlatformTextureList::appendTexture
              (in_RDX,(QRhiTexture *)in_RSI,pQVar2,pQVar6,(QRect *)&local_1c,
               (QFlags_conflict1 *)&local_58);
  }
  local_8c = 0;
  while( true ) {
    this = (QWidget *)(long)local_8c;
    qVar3 = QList<QObject_*>::size((QList<QObject_*> *)&nativeChildren_00->field_0x18);
    if (qVar3 <= (long)this) break;
    QList<QObject_*>::at
              ((QList<QObject_*> *)this,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    pQVar4 = qobject_cast<QWidget*>
                       ((QObject *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (pQVar4 != (QWidget *)0x0) {
      bVar1 = QWidget::isWindow(this);
      if (!bVar1) {
        bVar1 = hasPlatformWindow(this);
        if (bVar1) {
          QList<QWidget_*>::append
                    ((QList<QWidget_*> *)0x3ab009,
                     (parameter_type)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
      }
    }
    if (pQVar4 != (QWidget *)0x0) {
      bVar1 = QWidget::isWindow(this);
      if (!bVar1) {
        bVar1 = hasPlatformWindow(this);
        if (!bVar1) {
          bVar1 = QWidget::isHidden((QWidget *)0x3ab037);
          if (!bVar1) {
            pQVar5 = QWidgetPrivate::get((QWidget *)0x3ab045);
            if ((*(uint *)&pQVar5->field_0x250 >> 0x19 & 1) != 0) {
              findTextureWidgetsRecursively
                        (tlw_00,widget_00,in_RCX,(QList<QWidget_*> *)nativeChildren_00);
            }
          }
        }
      }
    }
    local_8c = local_8c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void findTextureWidgetsRecursively(QWidget *tlw, QWidget *widget,
                                          QPlatformTextureList *widgetTextures,
                                          QList<QWidget *> *nativeChildren)
{
    QWidgetPrivate *wd = QWidgetPrivate::get(widget);
    if (wd->renderToTexture) {
        QPlatformTextureList::Flags flags = wd->textureListFlags();
        const QRect rect(widget->mapTo(tlw, QPoint()), widget->size());
        QWidgetPrivate::TextureData data = wd->texture();
        widgetTextures->appendTexture(widget, data.textureLeft, data.textureRight, rect, wd->clipRect(), flags);
    }

    for (int i = 0; i < wd->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(wd->children.at(i));
        // Stop at native widgets but store them. Stop at hidden widgets too.
        if (w && !w->isWindow() && hasPlatformWindow(w))
            nativeChildren->append(w);
        if (w && !w->isWindow() && !hasPlatformWindow(w) && !w->isHidden() && QWidgetPrivate::get(w)->textureChildSeen)
            findTextureWidgetsRecursively(tlw, w, widgetTextures, nativeChildren);
    }
}